

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

void Amap_ManCleanData(Amap_Man_t *p)

{
  void *pvVar1;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->vObjs->nSize; i_00 = i_00 + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i_00);
    if (pvVar1 != (void *)0x0) {
      *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void Amap_ManCleanData( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    int i;
//    Amap_ManForEachNode( p, pObj, i )
//        ABC_FREE( pObj->pData );
    Amap_ManForEachObj( p, pObj, i )
        pObj->pData = NULL;
}